

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4.h
# Opt level: O2

CMatrix4<float> * __thiscall
irr::core::CMatrix4<float>::buildTextureTransform
          (CMatrix4<float> *this,f32 rotateRad,vector2df *rotatecenter,vector2df *translate,
          vector2df *scale)

{
  float fVar1;
  float fVar2;
  
  fVar1 = cosf((float)rotateRad);
  fVar2 = sinf((float)rotateRad);
  this->M[0] = scale->X * fVar1;
  this->M[1] = scale->Y * fVar2;
  this->M[2] = 0.0;
  this->M[3] = 0.0;
  this->M[4] = -fVar2 * scale->X;
  this->M[5] = scale->Y * fVar1;
  this->M[6] = 0.0;
  this->M[7] = 0.0;
  this->M[8] = (scale->X * fVar1 * rotatecenter->X - rotatecenter->Y * fVar2) + translate->X;
  this->M[9] = fVar2 * scale->Y * rotatecenter->X + fVar1 * rotatecenter->Y + translate->Y;
  this->M[10] = 1.0;
  this->M[0xb] = 0.0;
  this->M[0xc] = 0.0;
  this->M[0xd] = 0.0;
  this->M[0xe] = 0.0;
  this->M[0xf] = 1.0;
  return this;
}

Assistant:

inline CMatrix4<T> &CMatrix4<T>::buildTextureTransform(f32 rotateRad,
		const core::vector2df &rotatecenter,
		const core::vector2df &translate,
		const core::vector2df &scale)
{
	const f32 c = cosf(rotateRad);
	const f32 s = sinf(rotateRad);

	M[0] = (T)(c * scale.X);
	M[1] = (T)(s * scale.Y);
	M[2] = 0;
	M[3] = 0;

	M[4] = (T)(-s * scale.X);
	M[5] = (T)(c * scale.Y);
	M[6] = 0;
	M[7] = 0;

	M[8] = (T)(c * scale.X * rotatecenter.X + -s * rotatecenter.Y + translate.X);
	M[9] = (T)(s * scale.Y * rotatecenter.X + c * rotatecenter.Y + translate.Y);
	M[10] = 1;
	M[11] = 0;

	M[12] = 0;
	M[13] = 0;
	M[14] = 0;
	M[15] = 1;
#if defined(USE_MATRIX_TEST)
	definitelyIdentityMatrix = false;
#endif
	return *this;
}